

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::AttachmentPromiseNode<capnp::LocalClient::BlockingScope>::~AttachmentPromiseNode
          (AttachmentPromiseNode<capnp::LocalClient::BlockingScope> *this)

{
  LocalClient *pLVar1;
  BlockedCall *this_00;
  PromiseArenaMember *node;
  LocalClient *c;
  
  AttachmentPromiseNodeBase::dropDependency(&this->super_AttachmentPromiseNodeBase);
  pLVar1 = (this->attachment).client.ptr;
  if (pLVar1 != (LocalClient *)0x0) {
    pLVar1->blocked = false;
    do {
      this_00 = (pLVar1->blockedCalls).ptr;
      if (this_00 == (BlockedCall *)0x0) break;
      capnp::LocalClient::BlockedCall::unblock(this_00);
    } while (pLVar1->blocked != true);
  }
  (this->super_AttachmentPromiseNodeBase).super_PromiseNode.super_PromiseArenaMember.
  _vptr_PromiseArenaMember = (_func_int **)&PTR___cxa_pure_virtual_00708b58;
  node = &((this->super_AttachmentPromiseNodeBase).dependency.ptr)->super_PromiseArenaMember;
  if (node != (PromiseArenaMember *)0x0) {
    (this->super_AttachmentPromiseNodeBase).dependency.ptr = (PromiseNode *)0x0;
    PromiseDisposer::dispose(node);
  }
  AsyncObject::~AsyncObject((AsyncObject *)this);
  return;
}

Assistant:

~AttachmentPromiseNode() noexcept(false) {
    // We need to make sure the dependency is deleted before we delete the attachment because the
    // dependency may be using the attachment.
    dropDependency();
  }